

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rolemaskproxymodel.cpp
# Opt level: O0

void __thiscall RoleMaskProxyModel::setMaskHeaderData(RoleMaskProxyModel *this,bool val)

{
  long lVar1;
  QMap<int,_QVariant> local_b0;
  QList<QMap<int,_QVariant>_> local_a8;
  QMap<int,_QVariant> local_80;
  QList<QMap<int,_QVariant>_> local_78;
  QModelIndex local_60;
  int local_44;
  int rowCnt;
  int local_24;
  RoleMaskProxyModelPrivate *pRStack_20;
  int colCnt;
  RoleMaskProxyModelPrivate *d;
  RoleMaskProxyModel *pRStack_10;
  bool val_local;
  RoleMaskProxyModel *this_local;
  
  d._7_1_ = val;
  pRStack_10 = this;
  pRStack_20 = d_func(this);
  if ((d._7_1_ & 1) != (pRStack_20->m_maskHeaderData & 1U)) {
    pRStack_20->m_maskHeaderData = (bool)(d._7_1_ & 1);
    QModelIndex::QModelIndex((QModelIndex *)&stack0xffffffffffffffc0);
    local_24 = (**(code **)(*(long *)this + 0x80))(this,&stack0xffffffffffffffc0);
    QModelIndex::QModelIndex(&local_60);
    local_44 = (**(code **)(*(long *)this + 0x78))(this,&local_60);
    if ((d._7_1_ & 1) == 0) {
      QList<QMap<int,_QVariant>_>::clear(&pRStack_20->m_hHeaderData);
      QList<QMap<int,_QVariant>_>::clear(&pRStack_20->m_vHeaderData);
    }
    else {
      if (0 < local_24) {
        lVar1 = (long)local_24;
        local_80.d.d = (QExplicitlySharedDataPointerV2<QMapData<std::map<int,_QVariant,_std::less<int>,_std::allocator<std::pair<const_int,_QVariant>_>_>_>_>
                        )(QMapData<std::map<int,_QVariant,_std::less<int>,_std::allocator<std::pair<const_int,_QVariant>_>_>_>
                          *)0x0;
        QMap<int,_QVariant>::QMap(&local_80);
        QList<QMap<int,_QVariant>_>::QList(&local_78,lVar1,&local_80);
        QList<QMap<int,_QVariant>_>::operator=(&pRStack_20->m_hHeaderData,&local_78);
        QList<QMap<int,_QVariant>_>::~QList(&local_78);
        QMap<int,_QVariant>::~QMap(&local_80);
      }
      if (0 < local_44) {
        lVar1 = (long)local_44;
        local_b0.d.d = (QExplicitlySharedDataPointerV2<QMapData<std::map<int,_QVariant,_std::less<int>,_std::allocator<std::pair<const_int,_QVariant>_>_>_>_>
                        )(QMapData<std::map<int,_QVariant,_std::less<int>,_std::allocator<std::pair<const_int,_QVariant>_>_>_>
                          *)0x0;
        QMap<int,_QVariant>::QMap(&local_b0);
        QList<QMap<int,_QVariant>_>::QList(&local_a8,lVar1,&local_b0);
        QList<QMap<int,_QVariant>_>::operator=(&pRStack_20->m_vHeaderData,&local_a8);
        QList<QMap<int,_QVariant>_>::~QList(&local_a8);
        QMap<int,_QVariant>::~QMap(&local_b0);
      }
    }
    maskHeaderDataChanged(this,(bool)(d._7_1_ & 1));
    if (0 < local_24) {
      QAbstractItemModel::headerDataChanged((Orientation)this,1,0);
    }
    if (0 < local_44) {
      QAbstractItemModel::headerDataChanged((Orientation)this,2,0);
    }
  }
  return;
}

Assistant:

void RoleMaskProxyModel::setMaskHeaderData(bool val)
{
    Q_D(RoleMaskProxyModel);
    if (val == d->m_maskHeaderData)
        return;
    d->m_maskHeaderData = val;
    const int colCnt = columnCount();
    const int rowCnt = rowCount();
    if (val) {
        if (colCnt > 0)
            d->m_hHeaderData = QVector<RolesContainer>(colCnt, RolesContainer());
        if (rowCnt > 0)
            d->m_vHeaderData = QVector<RolesContainer>(rowCnt, RolesContainer());
    } else {
        d->m_hHeaderData.clear();
        d->m_vHeaderData.clear();
    }
    maskHeaderDataChanged(val);
    if (colCnt > 0)
        headerDataChanged(Qt::Horizontal, 0, colCnt - 1);
    if (rowCnt > 0)
        headerDataChanged(Qt::Vertical, 0, rowCnt - 1);
}